

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defopcode.c
# Opt level: O0

void replace_dollar_number_with_list(List *code,int field,List *list)

{
  ListStruct *pLVar1;
  List *__src;
  List *old_cdr;
  List *new;
  List *list_local;
  int field_local;
  List *code_local;
  
  if (code != (List *)0x0) {
    if (((code->token).type == TOK_DOLLAR_NUMBER) && ((uint)(code->token).u.reginfo.which == field))
    {
      __src = copy_list(list);
      pLVar1 = code->cdr;
      memcpy(code,__src,0x30);
      code->cdr = pLVar1;
    }
    else {
      replace_dollar_number_with_list(code->car,field,list);
    }
    replace_dollar_number_with_list(code->cdr,field,list);
  }
  return;
}

Assistant:

static void
replace_dollar_number_with_list (List *code, int field, List *list)
{
  if (code == NULL)
    return;

  if (code->token.type == TOK_DOLLAR_NUMBER
      && code->token.u.dollarinfo.which == field)
    {
      List *new = copy_list (list);
      List *old_cdr = code->cdr;

      *code = *new;
      code->cdr = old_cdr;
    }
  else
    replace_dollar_number_with_list (code->car, field, list);
  replace_dollar_number_with_list (code->cdr, field, list);
}